

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O0

void cmAddCustomCommandToTarget
               (void *arg,char *target,char *command,int numArgs,char **args,int commandType)

{
  cmCustomCommandType type;
  string *psVar1;
  pointer this;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_100;
  allocator<char> local_f1;
  string local_f0;
  cmCustomCommandLines local_d0;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_b8;
  __single_object cc;
  undefined1 local_a8 [4];
  cmCustomCommandType cctype;
  cmCustomCommandLines commandLines;
  int i;
  allocator<char> local_79;
  undefined1 local_78 [8];
  string expand;
  cmCustomCommandLine commandLine;
  cmMakefile *mf;
  int commandType_local;
  char **args_local;
  int numArgs_local;
  char *command_local;
  char *target_local;
  void *arg_local;
  
  cmCustomCommandLine::cmCustomCommandLine((cmCustomCommandLine *)((long)&expand.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_78,command,&local_79);
  std::allocator<char>::~allocator(&local_79);
  psVar1 = cmMakefile::ExpandVariablesInString((cmMakefile *)arg,(string *)local_78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&expand.field_2 + 8),psVar1);
  for (commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
       super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
      (int)commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
           super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage < numArgs;
      commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
      super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ =
           (int)commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                .super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage + 1) {
    std::__cxx11::string::operator=
              ((string *)local_78,
               args[(int)commandLines.
                         super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                         super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage]);
    psVar1 = cmMakefile::ExpandVariablesInString((cmMakefile *)arg,(string *)local_78);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&expand.field_2 + 8),psVar1);
  }
  cmCustomCommandLines::cmCustomCommandLines((cmCustomCommandLines *)local_a8);
  std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
            ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)local_a8,
             (value_type *)((long)&expand.field_2 + 8));
  cc._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
  super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
  super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl._4_4_ = POST_BUILD;
  if (commandType == 0) {
    cc._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
    super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
    super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl._4_4_ = PRE_BUILD;
  }
  else if (commandType == 1) {
    cc._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
    super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
    super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl._4_4_ = PRE_LINK;
  }
  else if (commandType == 2) {
    cc._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
    super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
    super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl._4_4_ = POST_BUILD;
  }
  std::make_unique<cmCustomCommand>();
  this = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                   (&local_b8);
  cmCustomCommandLines::cmCustomCommandLines(&local_d0,(cmCustomCommandLines *)local_a8);
  cmCustomCommand::SetCommandLines(this,&local_d0);
  cmCustomCommandLines::~cmCustomCommandLines(&local_d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,target,&local_f1);
  type = cc._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
         super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
         super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl._4_4_;
  std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::unique_ptr
            (&local_100,&local_b8);
  cmMakefile::AddCustomCommandToTarget((cmMakefile *)arg,&local_f0,type,&local_100);
  std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr(&local_100);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr(&local_b8);
  cmCustomCommandLines::~cmCustomCommandLines((cmCustomCommandLines *)local_a8);
  std::__cxx11::string::~string((string *)local_78);
  cmCustomCommandLine::~cmCustomCommandLine((cmCustomCommandLine *)((long)&expand.field_2 + 8));
  return;
}

Assistant:

static void CCONV cmAddCustomCommandToTarget(void* arg, const char* target,
                                             const char* command, int numArgs,
                                             const char** args,
                                             int commandType)
{
  // Get the makefile instance.
  cmMakefile* mf = static_cast<cmMakefile*>(arg);

  // Construct the command line for the command.  Perform an extra
  // variable expansion now because the API caller expects it.
  cmCustomCommandLine commandLine;
  std::string expand = command;
  commandLine.push_back(mf->ExpandVariablesInString(expand));
  for (int i = 0; i < numArgs; ++i) {
    expand = args[i];
    commandLine.push_back(mf->ExpandVariablesInString(expand));
  }
  cmCustomCommandLines commandLines;
  commandLines.push_back(commandLine);

  // Select the command type.
  cmCustomCommandType cctype = cmCustomCommandType::POST_BUILD;
  switch (commandType) {
    case CM_PRE_BUILD:
      cctype = cmCustomCommandType::PRE_BUILD;
      break;
    case CM_PRE_LINK:
      cctype = cmCustomCommandType::PRE_LINK;
      break;
    case CM_POST_BUILD:
      cctype = cmCustomCommandType::POST_BUILD;
      break;
  }

  // Pass the call to the makefile instance.
  auto cc = cm::make_unique<cmCustomCommand>();
  cc->SetCommandLines(commandLines);
  mf->AddCustomCommandToTarget(target, cctype, std::move(cc));
}